

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_tcp.cc
# Opt level: O2

void receive_vector<unsigned_int>
               (server<(connector::CONNECTOR_TYPE)0> *server,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  pointer puVar1;
  ostream *poVar2;
  uint32_t i;
  uint uVar3;
  uint local_38;
  uint local_34;
  uint32_t current_vec_size;
  uint element_memory;
  
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_38 = 0;
  connector::server<(connector::CONNECTOR_TYPE)0>::receive_tcp<unsigned_int>(server,&local_38);
  poVar2 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
  poVar2 = std::operator<<(poVar2,"server_tcp.cc");
  poVar2 = std::operator<<(poVar2,':');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21);
  poVar2 = std::operator<<(poVar2,':');
  poVar2 = std::operator<<(poVar2,"receive_vector");
  poVar2 = std::operator<<(poVar2,"()]: ");
  poVar2 = std::operator<<(poVar2,"Got current vec_size: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(vec,(ulong)local_38);
  poVar2 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
  poVar2 = std::operator<<(poVar2,"server_tcp.cc");
  poVar2 = std::operator<<(poVar2,':');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x24);
  poVar2 = std::operator<<(poVar2,':');
  poVar2 = std::operator<<(poVar2,"receive_vector");
  poVar2 = std::operator<<(poVar2,"()]: ");
  std::operator<<(poVar2,"Receiving vector:\n");
  for (uVar3 = 0; uVar3 < local_38; uVar3 = uVar3 + 1) {
    connector::server<(connector::CONNECTOR_TYPE)0>::receive_tcp<unsigned_int>(server,&local_34);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)vec,&local_34);
    poVar2 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
    poVar2 = std::operator<<(poVar2,"server_tcp.cc");
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a);
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = std::operator<<(poVar2,"receive_vector");
    poVar2 = std::operator<<(poVar2,"()]: ");
    poVar2 = std::operator<<(poVar2,"    - ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,'\n');
  }
  return;
}

Assistant:

void receive_vector(connector::server< connector::TCP > & server, std::vector< T > & vec)
{   
    // remove all elements from the vector
    vec.clear();
    // preallocate the size "member"
    uint32_t current_vec_size = 0;
    server.receive_tcp< uint32_t >( current_vec_size );
    DEBUG_MSG_CONNECTOR("Got current vec_size: " << current_vec_size << '\n');
    // preallocate space
    vec.reserve(current_vec_size);
    DEBUG_MSG_CONNECTOR("Receiving vector:\n");
    T element_memory;
    for ( uint32_t i = 0; i < current_vec_size; ++i )
    {
        server.receive_tcp< T >( element_memory );
        vec.emplace_back(element_memory);
        DEBUG_MSG_CONNECTOR("    - " << element_memory << '\n');
    }
}